

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

NameType * __thiscall
(anonymous_namespace)::Db::make<(anonymous_namespace)::NameType,char_const(&)[9]>
          (Db *this,char (*args) [9])

{
  NameType *pNVar1;
  size_t sVar2;
  
  pNVar1 = (NameType *)
           anon_unknown.dwarf_4afdb9::BumpPointerAllocator::allocate
                     ((BumpPointerAllocator *)(this + 0x2f0),0x20);
  sVar2 = strlen(*args);
  (pNVar1->super_Node).K = KNameType;
  (pNVar1->super_Node).RHSComponentCache = No;
  (pNVar1->super_Node).ArrayCache = No;
  (pNVar1->super_Node).FunctionCache = No;
  (pNVar1->super_Node)._vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_002066e0;
  (pNVar1->Name).First = *args;
  (pNVar1->Name).Last = *args + sVar2;
  return pNVar1;
}

Assistant:

T *make(Args &&... args) {
    return new (ASTAllocator.allocate(sizeof(T)))
        T(std::forward<Args>(args)...);
  }